

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O1

Elf32_Sym * elf32_symtab(LinkFile *lf,Elf32_Ehdr *ehdr,int idx)

{
  uchar uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Elf32_Shdr *pEVar4;
  uint be;
  
  uVar1 = ehdr->e_ident[5];
  pEVar4 = elf32_shdr(lf,ehdr,(uint16_t)idx);
  be = (uint)(uVar1 == '\x02');
  uVar2 = read32(be,pEVar4->sh_type);
  if ((uVar2 != 2) && (uVar2 != 0xb)) {
    error(0x32,lf->pathname,"symbol",lf->objname);
  }
  uVar2 = read32(be,pEVar4->sh_offset);
  uVar3 = read32(be,pEVar4->sh_size);
  elf_check_offset(lf,"symbol",(Elf32_Sym *)(ehdr->e_ident + uVar2),(ulong)uVar3);
  return (Elf32_Sym *)(ehdr->e_ident + uVar2);
}

Assistant:

static struct Elf32_Sym *elf32_symtab(struct LinkFile *lf,
                                      struct Elf32_Ehdr *ehdr,int idx)
/* returns a pointer to the symbol table */
{
  static char *tabname = "symbol";
  bool be = (ehdr->e_ident[EI_DATA] == ELFDATA2MSB);
  struct Elf32_Shdr *shdr;
  struct Elf32_Sym *symtab;
  uint32_t shtype;

  shdr = elf32_shdr(lf,ehdr,idx);
  shtype = read32(be,shdr->sh_type);
  if (shtype!=SHT_SYMTAB && shtype!=SHT_DYNSYM)
     error(50,lf->pathname,tabname,lf->objname);  /* illegal type */
  symtab = (struct Elf32_Sym *)((uint8_t *)ehdr + read32(be,shdr->sh_offset));
  elf_check_offset(lf,tabname,symtab,read32(be,shdr->sh_size));
  return symtab;
}